

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPile.cpp
# Opt level: O0

unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
 __thiscall solitaire::piles::StockPile::createSnapshot(StockPile *this)

{
  long in_RSI;
  undefined1 local_30 [32];
  StockPile *this_local;
  
  this_local = this;
  std::enable_shared_from_this<solitaire::piles::StockPile>::shared_from_this
            ((enable_shared_from_this<solitaire::piles::StockPile> *)local_30);
  std::
  make_unique<solitaire::piles::StockPile::Snapshot,std::shared_ptr<solitaire::piles::StockPile>,std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>&,std::optional<unsigned_int>&>
            ((shared_ptr<solitaire::piles::StockPile> *)(local_30 + 0x10),
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_30,
             (optional<unsigned_int> *)(in_RSI + 0x18));
  std::
  unique_ptr<solitaire::archivers::interfaces::Snapshot,std::default_delete<solitaire::archivers::interfaces::Snapshot>>
  ::
  unique_ptr<solitaire::piles::StockPile::Snapshot,std::default_delete<solitaire::piles::StockPile::Snapshot>,void>
            ((unique_ptr<solitaire::archivers::interfaces::Snapshot,std::default_delete<solitaire::archivers::interfaces::Snapshot>>
              *)this,(unique_ptr<solitaire::piles::StockPile::Snapshot,_std::default_delete<solitaire::piles::StockPile::Snapshot>_>
                      *)(local_30 + 0x10));
  std::
  unique_ptr<solitaire::piles::StockPile::Snapshot,_std::default_delete<solitaire::piles::StockPile::Snapshot>_>
  ::~unique_ptr((unique_ptr<solitaire::piles::StockPile::Snapshot,_std::default_delete<solitaire::piles::StockPile::Snapshot>_>
                 *)(local_30 + 0x10));
  std::shared_ptr<solitaire::piles::StockPile>::~shared_ptr
            ((shared_ptr<solitaire::piles::StockPile> *)local_30);
  return (__uniq_ptr_data<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>,_true,_true>
          )(__uniq_ptr_data<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<archivers::interfaces::Snapshot> StockPile::createSnapshot() {
    return std::make_unique<Snapshot>(shared_from_this(), cards, selectedCardIndex);
}